

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O3

int diffie_hellman_sha1(LIBSSH2_SESSION *session,BIGNUM *g,BIGNUM *p,int group_order,
                       uchar packet_type_init,uchar packet_type_reply,uchar *midhash,
                       unsigned_long midhash_len,kmdhgGPshakex_state_t *exchange_state)

{
  void **ppvVar1;
  undefined8 uVar2;
  LIBSSH2_SESSION *pLVar3;
  EVP_MD_CTX *ctx;
  uint uVar4;
  int iVar5;
  int iVar6;
  BN_CTX *pBVar7;
  BIGNUM *pBVar8;
  uchar *puVar9;
  uchar *puVar10;
  LIBSSH2_CRYPT_METHOD *pLVar11;
  _LIBSSH2_MAC_METHOD *p_Var12;
  LIBSSH2_COMP_METHOD *pLVar13;
  char *pcVar14;
  LIBSSH2_SESSION *pLVar15;
  long lVar16;
  size_t sVar17;
  EVP_MD_CTX *ctx_00;
  undefined7 in_register_00000081;
  size_t sVar18;
  uchar *puVar19;
  EVP_MD_CTX *hash;
  LIBSSH2_SESSION *local_50;
  EVP_MD_CTX *exchange_hash_ctx;
  int free_iv;
  int free_secret;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000081,packet_type_init);
  iVar5 = 0;
  local_50 = session;
  switch(exchange_state->state) {
  case libssh2_NB_state_idle:
    exchange_state->k_value = (uchar *)0x0;
    exchange_state->e_packet = (uchar *)0x0;
    exchange_state->s_packet = (uchar *)0x0;
    pBVar7 = BN_CTX_new();
    exchange_state->ctx = (BN_CTX *)pBVar7;
    pBVar8 = BN_new();
    exchange_state->x = (BIGNUM *)pBVar8;
    pBVar8 = BN_new();
    exchange_state->e = (BIGNUM *)pBVar8;
    pBVar8 = BN_new();
    exchange_state->f = (BIGNUM *)pBVar8;
    pBVar8 = BN_new();
    exchange_state->k = (BIGNUM *)pBVar8;
    *(undefined8 *)&exchange_state->req_state = 0;
    (exchange_state->req_state).start = 0;
    BN_rand((BIGNUM *)exchange_state->x,group_order * 8 + -1,0,-1);
    BN_mod_exp((BIGNUM *)exchange_state->e,(BIGNUM *)g,(BIGNUM *)exchange_state->x,(BIGNUM *)p,
               (BN_CTX *)exchange_state->ctx);
    iVar6 = BN_num_bits((BIGNUM *)exchange_state->e);
    iVar5 = iVar6 + 0xe;
    if (-1 < iVar6 + 7) {
      iVar5 = iVar6 + 7;
    }
    exchange_state->e_packet_len = (long)((iVar5 >> 3) + 6);
    uVar4 = BN_num_bits((BIGNUM *)exchange_state->e);
    pLVar15 = local_50;
    sVar17 = exchange_state->e_packet_len;
    if ((uVar4 & 7) != 0) {
      sVar17 = sVar17 - 1;
      exchange_state->e_packet_len = sVar17;
    }
    puVar9 = (uchar *)(*local_50->alloc)(sVar17,&local_50->abstract);
    exchange_state->e_packet = puVar9;
    if (puVar9 != (uchar *)0x0) {
      *puVar9 = (uchar)local_34;
      _libssh2_htonu32(exchange_state->e_packet + 1,(int)exchange_state->e_packet_len - 5);
      uVar4 = BN_num_bits((BIGNUM *)exchange_state->e);
      lVar16 = 5;
      if ((uVar4 & 7) == 0) {
        exchange_state->e_packet[5] = '\0';
        lVar16 = 6;
      }
      BN_bn2bin((BIGNUM *)exchange_state->e,exchange_state->e_packet + lVar16);
      exchange_state->state = libssh2_NB_state_created;
      goto switchD_0012282b_caseD_2;
    }
    pcVar14 = "Out of memory error";
    goto LAB_00122b95;
  default:
    goto switchD_0012282b_caseD_1;
  case libssh2_NB_state_created:
switchD_0012282b_caseD_2:
    pLVar15 = local_50;
    iVar5 = _libssh2_transport_send
                      (local_50,exchange_state->e_packet,exchange_state->e_packet_len,(uchar *)0x0,0
                      );
    if (iVar5 == -0x25) {
      return -0x25;
    }
    if (iVar5 == 0) {
      exchange_state->state = libssh2_NB_state_sent;
      break;
    }
    pcVar14 = "Unable to send KEX init message";
    goto LAB_00123547;
  case libssh2_NB_state_sent:
    break;
  case libssh2_NB_state_sent1:
    goto switchD_0012282b_caseD_4;
  case libssh2_NB_state_sent2:
    goto switchD_0012282b_caseD_5;
  case libssh2_NB_state_sent3:
    goto switchD_0012282b_caseD_6;
  }
  pLVar15 = local_50;
  if ((local_50->field_0x80 & 1) != 0) {
    iVar5 = _libssh2_packet_burn(local_50,&exchange_state->burn_state);
    if (iVar5 == -0x25) {
      return -0x25;
    }
    if (iVar5 < 1) goto switchD_0012282b_caseD_1;
    pLVar15->field_0x80 = pLVar15->field_0x80 & 0xfe;
  }
  exchange_state->state = libssh2_NB_state_sent1;
switchD_0012282b_caseD_4:
  pLVar15 = local_50;
  iVar5 = _libssh2_packet_require
                    (local_50,packet_type_reply,&exchange_state->s_packet,
                     &exchange_state->s_packet_len,0,(uchar *)0x0,0,&exchange_state->req_state);
  if (iVar5 == -0x25) {
    return -0x25;
  }
  if (iVar5 == 0) {
    exchange_state->s = exchange_state->s_packet + 1;
    uVar4 = _libssh2_ntohu32(exchange_state->s_packet + 1);
    pLVar15->server_hostkey_len = uVar4;
    exchange_state->s = exchange_state->s + 4;
    if (pLVar15->server_hostkey != (uchar *)0x0) {
      (*pLVar15->free)(pLVar15->server_hostkey,&pLVar15->abstract);
      uVar4 = pLVar15->server_hostkey_len;
    }
    puVar9 = (uchar *)(*pLVar15->alloc)((ulong)uVar4,&pLVar15->abstract);
    pLVar15->server_hostkey = puVar9;
    if (puVar9 == (uchar *)0x0) {
      pcVar14 = "Unable to allocate memory for a copy of the host key";
LAB_00122b95:
      iVar5 = -6;
    }
    else {
      memcpy(puVar9,exchange_state->s,(ulong)pLVar15->server_hostkey_len);
      exchange_state->s = exchange_state->s + pLVar15->server_hostkey_len;
      iVar5 = _libssh2_md5_init(&exchange_hash_ctx);
      if (iVar5 != 0) {
        EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,pLVar15->server_hostkey,
                         (ulong)pLVar15->server_hostkey_len);
        EVP_DigestFinal((EVP_MD_CTX *)exchange_hash_ctx,pLVar15->server_hostkey_md5,(uint *)0x0);
        EVP_MD_CTX_free(exchange_hash_ctx);
      }
      pLVar15->server_hostkey_md5_valid = (uint)(iVar5 != 0);
      iVar5 = _libssh2_sha1_init(&exchange_hash_ctx);
      if (iVar5 != 0) {
        EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,pLVar15->server_hostkey,
                         (ulong)pLVar15->server_hostkey_len);
        EVP_DigestFinal((EVP_MD_CTX *)exchange_hash_ctx,pLVar15->server_hostkey_sha1,(uint *)0x0);
        EVP_MD_CTX_free(exchange_hash_ctx);
      }
      pLVar15->server_hostkey_sha1_valid = (uint)(iVar5 != 0);
      ppvVar1 = &pLVar15->server_hostkey_abstract;
      iVar5 = (*pLVar15->hostkey->init)
                        (pLVar15,pLVar15->server_hostkey,(ulong)pLVar15->server_hostkey_len,ppvVar1)
      ;
      if (iVar5 == 0) {
        uVar4 = _libssh2_ntohu32(exchange_state->s);
        exchange_state->f_value_len = (ulong)uVar4;
        puVar9 = exchange_state->s + 4;
        exchange_state->f_value = puVar9;
        exchange_state->s = exchange_state->s + (ulong)uVar4 + 4;
        BN_bin2bn(puVar9,uVar4,(BIGNUM *)exchange_state->f);
        uVar4 = _libssh2_ntohu32(exchange_state->s);
        exchange_state->h_sig_len = (ulong)uVar4;
        puVar9 = exchange_state->s;
        exchange_state->s = puVar9 + 4;
        exchange_state->h_sig = puVar9 + 4;
        BN_mod_exp((BIGNUM *)exchange_state->k,(BIGNUM *)exchange_state->f,
                   (BIGNUM *)exchange_state->x,(BIGNUM *)p,(BN_CTX *)exchange_state->ctx);
        iVar6 = BN_num_bits((BIGNUM *)exchange_state->k);
        iVar5 = iVar6 + 0xe;
        if (-1 < iVar6 + 7) {
          iVar5 = iVar6 + 7;
        }
        exchange_state->k_value_len = (long)((iVar5 >> 3) + 5);
        uVar4 = BN_num_bits((BIGNUM *)exchange_state->k);
        sVar17 = exchange_state->k_value_len;
        if ((uVar4 & 7) != 0) {
          sVar17 = sVar17 - 1;
          exchange_state->k_value_len = sVar17;
        }
        puVar9 = (uchar *)(*pLVar15->alloc)(sVar17,&pLVar15->abstract);
        exchange_state->k_value = puVar9;
        if (puVar9 == (uchar *)0x0) {
          pcVar14 = "Unable to allocate buffer for K";
          goto LAB_00122b95;
        }
        _libssh2_htonu32(puVar9,(int)exchange_state->k_value_len - 4);
        uVar4 = BN_num_bits((BIGNUM *)exchange_state->k);
        lVar16 = 4;
        if ((uVar4 & 7) == 0) {
          exchange_state->k_value[4] = '\0';
          lVar16 = 5;
        }
        BN_bn2bin((BIGNUM *)exchange_state->k,exchange_state->k_value + lVar16);
        exchange_state->exchange_hash = &exchange_hash_ctx;
        _libssh2_sha1_init(&exchange_hash_ctx);
        puVar10 = (pLVar15->local).banner;
        puVar9 = exchange_state->h_sig_comp;
        if (puVar10 == (uchar *)0x0) {
          _libssh2_htonu32(puVar9,0x15);
          EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar9,4);
          pcVar14 = "SSH-2.0-libssh2_1.8.0";
          sVar18 = 0x15;
          ctx_00 = (EVP_MD_CTX *)exchange_hash_ctx;
        }
        else {
          sVar18 = strlen((char *)puVar10);
          _libssh2_htonu32(puVar9,(int)sVar18 - 2);
          EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar9,4);
          ctx_00 = (EVP_MD_CTX *)exchange_hash_ctx;
          pcVar14 = (char *)(local_50->local).banner;
          sVar18 = strlen(pcVar14);
          sVar18 = sVar18 - 2;
          pLVar15 = local_50;
        }
        EVP_DigestUpdate(ctx_00,pcVar14,sVar18);
        sVar18 = strlen((char *)(pLVar15->remote).banner);
        _libssh2_htonu32(puVar9,(uint32_t)sVar18);
        EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar9,4);
        ctx = exchange_hash_ctx;
        puVar10 = (local_50->remote).banner;
        sVar18 = strlen((char *)puVar10);
        pLVar15 = local_50;
        EVP_DigestUpdate((EVP_MD_CTX *)ctx,puVar10,sVar18);
        _libssh2_htonu32(puVar9,(uint32_t)(pLVar15->local).kexinit_len);
        EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar9,4);
        EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,(pLVar15->local).kexinit,
                         (pLVar15->local).kexinit_len);
        _libssh2_htonu32(puVar9,(uint32_t)(pLVar15->remote).kexinit_len);
        EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar9,4);
        EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,(pLVar15->remote).kexinit,
                         (pLVar15->remote).kexinit_len);
        _libssh2_htonu32(puVar9,pLVar15->server_hostkey_len);
        EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar9,4);
        EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,pLVar15->server_hostkey,
                         (ulong)pLVar15->server_hostkey_len);
        if ((char)local_34 == ' ') {
          _libssh2_htonu32(puVar9,0x400);
          _libssh2_htonu32(exchange_state->h_sig_comp + 4,0x600);
          _libssh2_htonu32(exchange_state->h_sig_comp + 8,0x800);
          EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar9,0xc);
        }
        if (midhash != (uchar *)0x0) {
          EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,midhash,midhash_len);
        }
        EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,exchange_state->e_packet + 1,
                         exchange_state->e_packet_len - 1);
        _libssh2_htonu32(puVar9,(uint32_t)exchange_state->f_value_len);
        EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,puVar9,4);
        EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,exchange_state->f_value,
                         exchange_state->f_value_len);
        EVP_DigestUpdate((EVP_MD_CTX *)exchange_hash_ctx,exchange_state->k_value,
                         exchange_state->k_value_len);
        EVP_DigestFinal((EVP_MD_CTX *)exchange_hash_ctx,puVar9,(uint *)0x0);
        EVP_MD_CTX_free(exchange_hash_ctx);
        iVar5 = (*pLVar15->hostkey->sig_verify)
                          (pLVar15,exchange_state->h_sig,exchange_state->h_sig_len,puVar9,0x14,
                           ppvVar1);
        if (iVar5 == 0) {
          exchange_state->c = '\x15';
          exchange_state->state = libssh2_NB_state_sent2;
switchD_0012282b_caseD_5:
          pLVar15 = local_50;
          iVar5 = _libssh2_transport_send(local_50,&exchange_state->c,1,(uchar *)0x0,0);
          if (iVar5 == -0x25) {
            return -0x25;
          }
          if (iVar5 == 0) {
            exchange_state->state = libssh2_NB_state_sent3;
switchD_0012282b_caseD_6:
            pLVar15 = local_50;
            iVar5 = _libssh2_packet_require
                              (local_50,'\x15',&exchange_state->tmp,&exchange_state->tmp_len,0,
                               (uchar *)0x0,0,&exchange_state->req_state);
            if (iVar5 == -0x25) {
              return -0x25;
            }
            if (iVar5 == 0) {
              *(byte *)&pLVar15->state = (byte)pLVar15->state | 2;
              (*pLVar15->free)(exchange_state->tmp,&pLVar15->abstract);
              if (pLVar15->session_id == (uchar *)0x0) {
                puVar9 = (uchar *)(*pLVar15->alloc)(0x14,&pLVar15->abstract);
                pLVar15->session_id = puVar9;
                if (puVar9 == (uchar *)0x0) {
                  pcVar14 = "Unable to allocate buffer for SHA digest";
                  goto LAB_00122b95;
                }
                *(undefined4 *)(puVar9 + 0x10) = *(undefined4 *)(exchange_state->h_sig_comp + 0x10);
                uVar2 = *(undefined8 *)(exchange_state->h_sig_comp + 8);
                *(undefined8 *)puVar9 = *(undefined8 *)exchange_state->h_sig_comp;
                *(undefined8 *)(puVar9 + 8) = uVar2;
                pLVar15->session_id_len = 0x14;
              }
              pLVar11 = (pLVar15->local).crypt;
              if (pLVar11->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
                (*pLVar11->dtor)(pLVar15,&(pLVar15->local).crypt_abstract);
                pLVar11 = (pLVar15->local).crypt;
              }
              if (pLVar11->init !=
                  (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
                   *)0x0) {
                free_iv = 0;
                free_secret = 0;
                puVar9 = (uchar *)(*pLVar15->alloc)((long)pLVar11->iv_len + 0x14,&pLVar15->abstract)
                ;
                if (puVar9 == (uchar *)0x0) {
                  iVar5 = -1;
                  goto switchD_0012282b_caseD_1;
                }
                pLVar11 = (pLVar15->local).crypt;
                if (pLVar11->iv_len != 0) {
                  sVar18 = 0;
                  do {
                    _libssh2_sha1_init(&hash);
                    EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,
                                     exchange_state->k_value_len);
                    EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x14);
                    if (sVar18 == 0) {
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,"A",1);
                      pLVar15 = local_50;
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,local_50->session_id,
                                       (ulong)local_50->session_id_len);
                    }
                    else {
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar9,sVar18);
                      pLVar15 = local_50;
                    }
                    EVP_DigestFinal((EVP_MD_CTX *)hash,puVar9 + sVar18,(uint *)0x0);
                    EVP_MD_CTX_free(hash);
                    sVar18 = sVar18 + 0x14;
                    pLVar11 = (pLVar15->local).crypt;
                  } while (sVar18 < (ulong)(long)pLVar11->iv_len);
                }
                pLVar15 = local_50;
                puVar10 = (uchar *)(*local_50->alloc)((long)pLVar11->secret_len + 0x14,
                                                      &local_50->abstract);
                if (puVar10 != (uchar *)0x0) {
                  pLVar11 = (pLVar15->local).crypt;
                  if (pLVar11->secret_len != 0) {
                    sVar18 = 0;
                    do {
                      _libssh2_sha1_init(&hash);
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,
                                       exchange_state->k_value_len);
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x14);
                      if (sVar18 == 0) {
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,"C",1);
                        pLVar15 = local_50;
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,local_50->session_id,
                                         (ulong)local_50->session_id_len);
                      }
                      else {
                        EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar10,sVar18);
                        pLVar15 = local_50;
                      }
                      EVP_DigestFinal((EVP_MD_CTX *)hash,puVar10 + sVar18,(uint *)0x0);
                      EVP_MD_CTX_free(hash);
                      sVar18 = sVar18 + 0x14;
                      pLVar11 = (pLVar15->local).crypt;
                    } while (sVar18 < (ulong)(long)pLVar11->secret_len);
                  }
                  pLVar15 = local_50;
                  iVar5 = (*pLVar11->init)(local_50,pLVar11,puVar9,&free_iv,puVar10,&free_secret,1,
                                           &(local_50->local).crypt_abstract);
                  puVar19 = puVar9;
                  if (iVar5 == 0) {
                    if (free_iv != 0) {
                      memset(puVar9,0,(long)((pLVar15->local).crypt)->iv_len);
                      (*pLVar15->free)(puVar9,&pLVar15->abstract);
                    }
                    if (free_secret != 0) {
                      memset(puVar10,0,(long)((pLVar15->local).crypt)->secret_len);
                      (*pLVar15->free)(puVar10,&pLVar15->abstract);
                    }
                    goto LAB_001232ee;
                  }
LAB_0012351b:
                  puVar9 = puVar10;
                  (*pLVar15->free)(puVar19,&pLVar15->abstract);
                }
LAB_00123612:
                (*pLVar15->free)(puVar9,&pLVar15->abstract);
LAB_0012361a:
                iVar5 = -5;
                goto switchD_0012282b_caseD_1;
              }
LAB_001232ee:
              pLVar11 = (pLVar15->remote).crypt;
              if (pLVar11->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
                (*pLVar11->dtor)(pLVar15,&(pLVar15->remote).crypt_abstract);
                pLVar11 = (pLVar15->remote).crypt;
              }
              if (pLVar11->init !=
                  (_func_int_LIBSSH2_SESSION_ptr_LIBSSH2_CRYPT_METHOD_ptr_uchar_ptr_int_ptr_uchar_ptr_int_ptr_int_void_ptr_ptr
                   *)0x0) {
                free_iv = 0;
                free_secret = 0;
                puVar9 = (uchar *)(*pLVar15->alloc)((long)pLVar11->iv_len + 0x14,&pLVar15->abstract)
                ;
                if (puVar9 == (uchar *)0x0) goto LAB_0012361a;
                pLVar11 = (pLVar15->remote).crypt;
                if (pLVar11->iv_len != 0) {
                  sVar18 = 0;
                  do {
                    _libssh2_sha1_init(&hash);
                    EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,
                                     exchange_state->k_value_len);
                    EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x14);
                    if (sVar18 == 0) {
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,"B",1);
                      pLVar15 = local_50;
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,local_50->session_id,
                                       (ulong)local_50->session_id_len);
                    }
                    else {
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar9,sVar18);
                      pLVar15 = local_50;
                    }
                    EVP_DigestFinal((EVP_MD_CTX *)hash,puVar9 + sVar18,(uint *)0x0);
                    EVP_MD_CTX_free(hash);
                    sVar18 = sVar18 + 0x14;
                    pLVar11 = (pLVar15->remote).crypt;
                  } while (sVar18 < (ulong)(long)pLVar11->iv_len);
                }
                pLVar15 = local_50;
                puVar10 = (uchar *)(*local_50->alloc)((long)pLVar11->secret_len + 0x14,
                                                      &local_50->abstract);
                if (puVar10 == (uchar *)0x0) goto LAB_00123612;
                pLVar11 = (pLVar15->remote).crypt;
                if (pLVar11->secret_len != 0) {
                  sVar18 = 0;
                  do {
                    _libssh2_sha1_init(&hash);
                    EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,
                                     exchange_state->k_value_len);
                    EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x14);
                    if (sVar18 == 0) {
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,"D",1);
                      pLVar15 = local_50;
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,local_50->session_id,
                                       (ulong)local_50->session_id_len);
                    }
                    else {
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar10,sVar18);
                      pLVar15 = local_50;
                    }
                    EVP_DigestFinal((EVP_MD_CTX *)hash,puVar10 + sVar18,(uint *)0x0);
                    EVP_MD_CTX_free(hash);
                    sVar18 = sVar18 + 0x14;
                    pLVar11 = (pLVar15->remote).crypt;
                  } while (sVar18 < (ulong)(long)pLVar11->secret_len);
                }
                pLVar15 = local_50;
                iVar5 = (*pLVar11->init)(local_50,pLVar11,puVar9,&free_iv,puVar10,&free_secret,0,
                                         &(local_50->remote).crypt_abstract);
                puVar19 = puVar9;
                if (iVar5 != 0) goto LAB_0012351b;
                if (free_iv != 0) {
                  memset(puVar9,0,(long)((pLVar15->remote).crypt)->iv_len);
                  (*pLVar15->free)(puVar9,&pLVar15->abstract);
                }
                if (free_secret != 0) {
                  memset(puVar10,0,(long)((pLVar15->remote).crypt)->secret_len);
                  (*pLVar15->free)(puVar10,&pLVar15->abstract);
                }
              }
              p_Var12 = (pLVar15->local).mac;
              if (p_Var12->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
                (*p_Var12->dtor)(pLVar15,&(pLVar15->local).mac_abstract);
                p_Var12 = (pLVar15->local).mac;
              }
              if (p_Var12->init !=
                  (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
                free_iv = 0;
                puVar9 = (uchar *)(*pLVar15->alloc)((long)p_Var12->key_len + 0x14,&pLVar15->abstract
                                                   );
                if (puVar9 == (uchar *)0x0) goto LAB_0012361a;
                p_Var12 = (pLVar15->local).mac;
                if (p_Var12->key_len != 0) {
                  sVar18 = 0;
                  do {
                    _libssh2_sha1_init(&hash);
                    EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,
                                     exchange_state->k_value_len);
                    EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x14);
                    if (sVar18 == 0) {
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,"E",1);
                      pLVar15 = local_50;
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,local_50->session_id,
                                       (ulong)local_50->session_id_len);
                    }
                    else {
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar9,sVar18);
                      pLVar15 = local_50;
                    }
                    EVP_DigestFinal((EVP_MD_CTX *)hash,puVar9 + sVar18,(uint *)0x0);
                    EVP_MD_CTX_free(hash);
                    sVar18 = sVar18 + 0x14;
                    p_Var12 = (pLVar15->local).mac;
                  } while (sVar18 < (ulong)(long)p_Var12->key_len);
                }
                pLVar15 = local_50;
                (*p_Var12->init)(local_50,puVar9,&free_iv,&(local_50->local).mac_abstract);
                if (free_iv != 0) {
                  memset(puVar9,0,(long)((pLVar15->local).mac)->key_len);
                  (*pLVar15->free)(puVar9,&pLVar15->abstract);
                }
              }
              p_Var12 = (pLVar15->remote).mac;
              if (p_Var12->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
                (*p_Var12->dtor)(pLVar15,&(pLVar15->remote).mac_abstract);
                p_Var12 = (pLVar15->remote).mac;
              }
              if (p_Var12->init !=
                  (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_int_ptr_void_ptr_ptr *)0x0) {
                free_iv = 0;
                puVar9 = (uchar *)(*pLVar15->alloc)((long)p_Var12->key_len + 0x14,&pLVar15->abstract
                                                   );
                if (puVar9 == (uchar *)0x0) goto LAB_0012361a;
                p_Var12 = (pLVar15->remote).mac;
                if (p_Var12->key_len != 0) {
                  sVar18 = 0;
                  do {
                    _libssh2_sha1_init(&hash);
                    EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->k_value,
                                     exchange_state->k_value_len);
                    EVP_DigestUpdate((EVP_MD_CTX *)hash,exchange_state->h_sig_comp,0x14);
                    if (sVar18 == 0) {
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,"F",1);
                      pLVar15 = local_50;
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,local_50->session_id,
                                       (ulong)local_50->session_id_len);
                    }
                    else {
                      EVP_DigestUpdate((EVP_MD_CTX *)hash,puVar9,sVar18);
                      pLVar15 = local_50;
                    }
                    EVP_DigestFinal((EVP_MD_CTX *)hash,puVar9 + sVar18,(uint *)0x0);
                    EVP_MD_CTX_free(hash);
                    sVar18 = sVar18 + 0x14;
                    p_Var12 = (pLVar15->remote).mac;
                  } while (sVar18 < (ulong)(long)p_Var12->key_len);
                }
                pLVar15 = local_50;
                (*p_Var12->init)(local_50,puVar9,&free_iv,&(local_50->remote).mac_abstract);
                if (free_iv != 0) {
                  memset(puVar9,0,(long)((pLVar15->remote).mac)->key_len);
                  (*pLVar15->free)(puVar9,&pLVar15->abstract);
                }
              }
              pLVar3 = local_50;
              pLVar13 = (pLVar15->local).comp;
              if (pLVar13 != (LIBSSH2_COMP_METHOD *)0x0) {
                if (pLVar13->dtor != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
                  (*pLVar13->dtor)(local_50,1,&(local_50->local).comp_abstract);
                  pLVar13 = (pLVar3->local).comp;
                  if (pLVar13 == (LIBSSH2_COMP_METHOD *)0x0) goto LAB_001239a0;
                }
                if (pLVar13->init != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
                  iVar6 = (*pLVar13->init)(local_50,1,&(local_50->local).comp_abstract);
                  iVar5 = -5;
                  if (iVar6 != 0) goto switchD_0012282b_caseD_1;
                }
              }
LAB_001239a0:
              pLVar15 = local_50;
              pLVar13 = (local_50->remote).comp;
              iVar5 = 0;
              if (pLVar13 != (LIBSSH2_COMP_METHOD *)0x0) {
                if (pLVar13->dtor != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
                  iVar5 = 0;
                  (*pLVar13->dtor)(local_50,0,&(local_50->remote).comp_abstract);
                  pLVar13 = (pLVar15->remote).comp;
                  if (pLVar13 == (LIBSSH2_COMP_METHOD *)0x0) goto switchD_0012282b_caseD_1;
                }
                iVar5 = 0;
                if (pLVar13->init != (_func_int_LIBSSH2_SESSION_ptr_int_void_ptr_ptr *)0x0) {
                  iVar5 = (*pLVar13->init)(local_50,0,&(local_50->remote).comp_abstract);
                  iVar5 = (uint)(iVar5 == 0) * 5 + -5;
                }
              }
              goto switchD_0012282b_caseD_1;
            }
            pcVar14 = "Timed out waiting for NEWKEYS";
          }
          else {
            pcVar14 = "Unable to send NEWKEYS message";
          }
        }
        else {
          pcVar14 = "Unable to verify hostkey signature";
          iVar5 = -0xb;
        }
      }
      else {
        pcVar14 = "Unable to initialize hostkey importer";
        iVar5 = -10;
      }
    }
  }
  else {
    pcVar14 = "Timed out waiting for KEX reply";
    iVar5 = -9;
  }
LAB_00123547:
  iVar5 = _libssh2_error(pLVar15,iVar5,pcVar14);
switchD_0012282b_caseD_1:
  BN_clear_free((BIGNUM *)exchange_state->x);
  exchange_state->x = (BIGNUM *)0x0;
  BN_clear_free((BIGNUM *)exchange_state->e);
  exchange_state->e = (BIGNUM *)0x0;
  BN_clear_free((BIGNUM *)exchange_state->f);
  exchange_state->f = (BIGNUM *)0x0;
  BN_clear_free((BIGNUM *)exchange_state->k);
  exchange_state->k = (BIGNUM *)0x0;
  BN_CTX_free((BN_CTX *)exchange_state->ctx);
  pLVar15 = local_50;
  exchange_state->ctx = (BN_CTX *)0x0;
  if (exchange_state->e_packet != (uchar *)0x0) {
    (*local_50->free)(exchange_state->e_packet,&local_50->abstract);
    exchange_state->e_packet = (uchar *)0x0;
  }
  if (exchange_state->s_packet != (uchar *)0x0) {
    (*pLVar15->free)(exchange_state->s_packet,&pLVar15->abstract);
    exchange_state->s_packet = (uchar *)0x0;
  }
  if (exchange_state->k_value != (uchar *)0x0) {
    (*pLVar15->free)(exchange_state->k_value,&pLVar15->abstract);
    exchange_state->k_value = (uchar *)0x0;
  }
  exchange_state->state = libssh2_NB_state_idle;
  return iVar5;
}

Assistant:

static int diffie_hellman_sha1(LIBSSH2_SESSION *session,
                               _libssh2_bn *g,
                               _libssh2_bn *p,
                               int group_order,
                               unsigned char packet_type_init,
                               unsigned char packet_type_reply,
                               unsigned char *midhash,
                               unsigned long midhash_len,
                               kmdhgGPshakex_state_t *exchange_state)
{
    int ret = 0;
    int rc;
    libssh2_sha1_ctx exchange_hash_ctx;

    if (exchange_state->state == libssh2_NB_state_idle) {
        /* Setup initial values */
        exchange_state->e_packet = NULL;
        exchange_state->s_packet = NULL;
        exchange_state->k_value = NULL;
        exchange_state->ctx = _libssh2_bn_ctx_new();
        exchange_state->x = _libssh2_bn_init(); /* Random from client */
        exchange_state->e = _libssh2_bn_init(); /* g^x mod p */
        exchange_state->f = _libssh2_bn_init_from_bin(); /* g^(Random from server) mod p */
        exchange_state->k = _libssh2_bn_init(); /* The shared secret: f^x mod p */

        /* Zero the whole thing out */
        memset(&exchange_state->req_state, 0, sizeof(packet_require_state_t));

        /* Generate x and e */
        _libssh2_bn_rand(exchange_state->x, group_order * 8 - 1, 0, -1);
        _libssh2_bn_mod_exp(exchange_state->e, g, exchange_state->x, p,
                            exchange_state->ctx);

        /* Send KEX init */
        /* packet_type(1) + String Length(4) + leading 0(1) */
        exchange_state->e_packet_len =
            _libssh2_bn_bytes(exchange_state->e) + 6;
        if (_libssh2_bn_bits(exchange_state->e) % 8) {
            /* Leading 00 not needed */
            exchange_state->e_packet_len--;
        }

        exchange_state->e_packet =
            LIBSSH2_ALLOC(session, exchange_state->e_packet_len);
        if (!exchange_state->e_packet) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                 "Out of memory error");
            goto clean_exit;
        }
        exchange_state->e_packet[0] = packet_type_init;
        _libssh2_htonu32(exchange_state->e_packet + 1,
                         exchange_state->e_packet_len - 5);
        if (_libssh2_bn_bits(exchange_state->e) % 8) {
            _libssh2_bn_to_bin(exchange_state->e,
                               exchange_state->e_packet + 5);
        } else {
            exchange_state->e_packet[5] = 0;
            _libssh2_bn_to_bin(exchange_state->e,
                               exchange_state->e_packet + 6);
        }

        _libssh2_debug(session, LIBSSH2_TRACE_KEX, "Sending KEX packet %d",
                       (int) packet_type_init);
        exchange_state->state = libssh2_NB_state_created;
    }

    if (exchange_state->state == libssh2_NB_state_created) {
        rc = _libssh2_transport_send(session, exchange_state->e_packet,
                                     exchange_state->e_packet_len,
                                     NULL, 0);
        if (rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        } else if (rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to send KEX init message");
            goto clean_exit;
        }
        exchange_state->state = libssh2_NB_state_sent;
    }

    if (exchange_state->state == libssh2_NB_state_sent) {
        if (session->burn_optimistic_kexinit) {
            /* The first KEX packet to come along will be the guess initially
             * sent by the server.  That guess turned out to be wrong so we
             * need to silently ignore it */
            int burn_type;

            _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                           "Waiting for badly guessed KEX packet (to be ignored)");
            burn_type =
                _libssh2_packet_burn(session, &exchange_state->burn_state);
            if (burn_type == LIBSSH2_ERROR_EAGAIN) {
                return burn_type;
            } else if (burn_type <= 0) {
                /* Failed to receive a packet */
                ret = burn_type;
                goto clean_exit;
            }
            session->burn_optimistic_kexinit = 0;

            _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                           "Burnt packet of type: %02x",
                           (unsigned int) burn_type);
        }

        exchange_state->state = libssh2_NB_state_sent1;
    }

    if (exchange_state->state == libssh2_NB_state_sent1) {
        /* Wait for KEX reply */
        rc = _libssh2_packet_require(session, packet_type_reply,
                                     &exchange_state->s_packet,
                                     &exchange_state->s_packet_len, 0, NULL,
                                     0, &exchange_state->req_state);
        if (rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        if (rc) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_TIMEOUT,
                                 "Timed out waiting for KEX reply");
            goto clean_exit;
        }

        /* Parse KEXDH_REPLY */
        exchange_state->s = exchange_state->s_packet + 1;

        session->server_hostkey_len = _libssh2_ntohu32(exchange_state->s);
        exchange_state->s += 4;

        if (session->server_hostkey)
            LIBSSH2_FREE(session, session->server_hostkey);

        session->server_hostkey =
            LIBSSH2_ALLOC(session, session->server_hostkey_len);
        if (!session->server_hostkey) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                 "Unable to allocate memory for a copy "
                                 "of the host key");
            goto clean_exit;
        }
        memcpy(session->server_hostkey, exchange_state->s,
               session->server_hostkey_len);
        exchange_state->s += session->server_hostkey_len;

#if LIBSSH2_MD5
        {
            libssh2_md5_ctx fingerprint_ctx;

            if (libssh2_md5_init(&fingerprint_ctx)) {
                libssh2_md5_update(fingerprint_ctx, session->server_hostkey,
                                   session->server_hostkey_len);
                libssh2_md5_final(fingerprint_ctx,
                                  session->server_hostkey_md5);
                session->server_hostkey_md5_valid = TRUE;
            }
            else {
                session->server_hostkey_md5_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char fingerprint[50], *fprint = fingerprint;
            int i;
            for(i = 0; i < 16; i++, fprint += 3) {
                snprintf(fprint, 4, "%02x:", session->server_hostkey_md5[i]);
            }
            *(--fprint) = '\0';
            _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                           "Server's MD5 Fingerprint: %s", fingerprint);
        }
#endif /* LIBSSH2DEBUG */
#endif /* ! LIBSSH2_MD5 */

        {
            libssh2_sha1_ctx fingerprint_ctx;

            if (libssh2_sha1_init(&fingerprint_ctx)) {
                libssh2_sha1_update(fingerprint_ctx, session->server_hostkey,
                                    session->server_hostkey_len);
                libssh2_sha1_final(fingerprint_ctx,
                                   session->server_hostkey_sha1);
                session->server_hostkey_sha1_valid = TRUE;
            }
            else {
                session->server_hostkey_sha1_valid = FALSE;
            }
        }
#ifdef LIBSSH2DEBUG
        {
            char fingerprint[64], *fprint = fingerprint;
            int i;

            for(i = 0; i < 20; i++, fprint += 3) {
                snprintf(fprint, 4, "%02x:", session->server_hostkey_sha1[i]);
            }
            *(--fprint) = '\0';
            _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                           "Server's SHA1 Fingerprint: %s", fingerprint);
        }
#endif /* LIBSSH2DEBUG */

        if (session->hostkey->init(session, session->server_hostkey,
                                   session->server_hostkey_len,
                                   &session->server_hostkey_abstract)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_INIT,
                                 "Unable to initialize hostkey importer");
            goto clean_exit;
        }

        exchange_state->f_value_len = _libssh2_ntohu32(exchange_state->s);
        exchange_state->s += 4;
        exchange_state->f_value = exchange_state->s;
        exchange_state->s += exchange_state->f_value_len;
        _libssh2_bn_from_bin(exchange_state->f, exchange_state->f_value_len,
                             exchange_state->f_value);

        exchange_state->h_sig_len = _libssh2_ntohu32(exchange_state->s);
        exchange_state->s += 4;
        exchange_state->h_sig = exchange_state->s;

        /* Compute the shared secret */
        _libssh2_bn_mod_exp(exchange_state->k, exchange_state->f,
                            exchange_state->x, p, exchange_state->ctx);
        exchange_state->k_value_len = _libssh2_bn_bytes(exchange_state->k) + 5;
        if (_libssh2_bn_bits(exchange_state->k) % 8) {
            /* don't need leading 00 */
            exchange_state->k_value_len--;
        }
        exchange_state->k_value =
            LIBSSH2_ALLOC(session, exchange_state->k_value_len);
        if (!exchange_state->k_value) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                 "Unable to allocate buffer for K");
            goto clean_exit;
        }
        _libssh2_htonu32(exchange_state->k_value,
                         exchange_state->k_value_len - 4);
        if (_libssh2_bn_bits(exchange_state->k) % 8) {
            _libssh2_bn_to_bin(exchange_state->k, exchange_state->k_value + 4);
        } else {
            exchange_state->k_value[4] = 0;
            _libssh2_bn_to_bin(exchange_state->k, exchange_state->k_value + 5);
        }

        exchange_state->exchange_hash = (void*)&exchange_hash_ctx;
        libssh2_sha1_init(&exchange_hash_ctx);

        if (session->local.banner) {
            _libssh2_htonu32(exchange_state->h_sig_comp,
                             strlen((char *) session->local.banner) - 2);
            libssh2_sha1_update(exchange_hash_ctx,
                                exchange_state->h_sig_comp, 4);
            libssh2_sha1_update(exchange_hash_ctx,
                                (char *) session->local.banner,
                                strlen((char *) session->local.banner) - 2);
        } else {
            _libssh2_htonu32(exchange_state->h_sig_comp,
                             sizeof(LIBSSH2_SSH_DEFAULT_BANNER) - 1);
            libssh2_sha1_update(exchange_hash_ctx,
                                exchange_state->h_sig_comp, 4);
            libssh2_sha1_update(exchange_hash_ctx,
                                LIBSSH2_SSH_DEFAULT_BANNER,
                                sizeof(LIBSSH2_SSH_DEFAULT_BANNER) - 1);
        }

        _libssh2_htonu32(exchange_state->h_sig_comp,
                         strlen((char *) session->remote.banner));
        libssh2_sha1_update(exchange_hash_ctx,
                            exchange_state->h_sig_comp, 4);
        libssh2_sha1_update(exchange_hash_ctx,
                            session->remote.banner,
                            strlen((char *) session->remote.banner));

        _libssh2_htonu32(exchange_state->h_sig_comp,
                         session->local.kexinit_len);
        libssh2_sha1_update(exchange_hash_ctx,
                            exchange_state->h_sig_comp, 4);
        libssh2_sha1_update(exchange_hash_ctx,
                            session->local.kexinit,
                            session->local.kexinit_len);

        _libssh2_htonu32(exchange_state->h_sig_comp,
                         session->remote.kexinit_len);
        libssh2_sha1_update(exchange_hash_ctx,
                            exchange_state->h_sig_comp, 4);
        libssh2_sha1_update(exchange_hash_ctx,
                            session->remote.kexinit,
                            session->remote.kexinit_len);

        _libssh2_htonu32(exchange_state->h_sig_comp,
                         session->server_hostkey_len);
        libssh2_sha1_update(exchange_hash_ctx,
                            exchange_state->h_sig_comp, 4);
        libssh2_sha1_update(exchange_hash_ctx,
                            session->server_hostkey,
                            session->server_hostkey_len);

        if (packet_type_init == SSH_MSG_KEX_DH_GEX_INIT) {
            /* diffie-hellman-group-exchange hashes additional fields */
#ifdef LIBSSH2_DH_GEX_NEW
            _libssh2_htonu32(exchange_state->h_sig_comp,
                             LIBSSH2_DH_GEX_MINGROUP);
            _libssh2_htonu32(exchange_state->h_sig_comp + 4,
                             LIBSSH2_DH_GEX_OPTGROUP);
            _libssh2_htonu32(exchange_state->h_sig_comp + 8,
                             LIBSSH2_DH_GEX_MAXGROUP);
            libssh2_sha1_update(exchange_hash_ctx,
                                exchange_state->h_sig_comp, 12);
#else
            _libssh2_htonu32(exchange_state->h_sig_comp,
                             LIBSSH2_DH_GEX_OPTGROUP);
            libssh2_sha1_update(exchange_hash_ctx,
                                exchange_state->h_sig_comp, 4);
#endif
        }

        if (midhash) {
            libssh2_sha1_update(exchange_hash_ctx, midhash,
                                midhash_len);
        }

        libssh2_sha1_update(exchange_hash_ctx,
                            exchange_state->e_packet + 1,
                            exchange_state->e_packet_len - 1);

        _libssh2_htonu32(exchange_state->h_sig_comp,
                         exchange_state->f_value_len);
        libssh2_sha1_update(exchange_hash_ctx,
                            exchange_state->h_sig_comp, 4);
        libssh2_sha1_update(exchange_hash_ctx,
                            exchange_state->f_value,
                            exchange_state->f_value_len);

        libssh2_sha1_update(exchange_hash_ctx,
                            exchange_state->k_value,
                            exchange_state->k_value_len);

        libssh2_sha1_final(exchange_hash_ctx,
                           exchange_state->h_sig_comp);

        if (session->hostkey->
            sig_verify(session, exchange_state->h_sig,
                       exchange_state->h_sig_len, exchange_state->h_sig_comp,
                       20, &session->server_hostkey_abstract)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_HOSTKEY_SIGN,
                                 "Unable to verify hostkey signature");
            goto clean_exit;
        }

        _libssh2_debug(session, LIBSSH2_TRACE_KEX, "Sending NEWKEYS message");
        exchange_state->c = SSH_MSG_NEWKEYS;

        exchange_state->state = libssh2_NB_state_sent2;
    }

    if (exchange_state->state == libssh2_NB_state_sent2) {
        rc = _libssh2_transport_send(session, &exchange_state->c, 1, NULL, 0);
        if (rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        } else if (rc) {
            ret = _libssh2_error(session, rc, "Unable to send NEWKEYS message");
            goto clean_exit;
        }

        exchange_state->state = libssh2_NB_state_sent3;
    }

    if (exchange_state->state == libssh2_NB_state_sent3) {
        rc = _libssh2_packet_require(session, SSH_MSG_NEWKEYS,
                                     &exchange_state->tmp,
                                     &exchange_state->tmp_len, 0, NULL, 0,
                                     &exchange_state->req_state);
        if (rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        } else if (rc) {
            ret = _libssh2_error(session, rc, "Timed out waiting for NEWKEYS");
            goto clean_exit;
        }
        /* The first key exchange has been performed,
           switch to active crypt/comp/mac mode */
        session->state |= LIBSSH2_STATE_NEWKEYS;
        _libssh2_debug(session, LIBSSH2_TRACE_KEX, "Received NEWKEYS message");

        /* This will actually end up being just packet_type(1)
           for this packet type anyway */
        LIBSSH2_FREE(session, exchange_state->tmp);

        if (!session->session_id) {
            session->session_id = LIBSSH2_ALLOC(session, SHA_DIGEST_LENGTH);
            if (!session->session_id) {
                ret = _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                     "Unable to allocate buffer for SHA digest");
                goto clean_exit;
            }
            memcpy(session->session_id, exchange_state->h_sig_comp,
                   SHA_DIGEST_LENGTH);
            session->session_id_len = SHA_DIGEST_LENGTH;
            _libssh2_debug(session, LIBSSH2_TRACE_KEX, "session_id calculated");
        }

        /* Cleanup any existing cipher */
        if (session->local.crypt->dtor) {
            session->local.crypt->dtor(session,
                                       &session->local.crypt_abstract);
        }

        /* Calculate IV/Secret/Key for each direction */
        if (session->local.crypt->init) {
            unsigned char *iv = NULL, *secret = NULL;
            int free_iv = 0, free_secret = 0;

            LIBSSH2_KEX_METHOD_DIFFIE_HELLMAN_SHA1_HASH(iv,
                                                        session->local.crypt->
                                                        iv_len, "A");
            if (!iv) {
                ret = -1;
                goto clean_exit;
            }
            LIBSSH2_KEX_METHOD_DIFFIE_HELLMAN_SHA1_HASH(secret,
                                                        session->local.crypt->
                                                        secret_len, "C");
            if (!secret) {
                LIBSSH2_FREE(session, iv);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            if (session->local.crypt->
                init(session, session->local.crypt, iv, &free_iv, secret,
                     &free_secret, 1, &session->local.crypt_abstract)) {
                LIBSSH2_FREE(session, iv);
                LIBSSH2_FREE(session, secret);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }

            if (free_iv) {
                memset(iv, 0, session->local.crypt->iv_len);
                LIBSSH2_FREE(session, iv);
            }

            if (free_secret) {
                memset(secret, 0, session->local.crypt->secret_len);
                LIBSSH2_FREE(session, secret);
            }
        }
        _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                       "Client to Server IV and Key calculated");

        if (session->remote.crypt->dtor) {
            /* Cleanup any existing cipher */
            session->remote.crypt->dtor(session,
                                        &session->remote.crypt_abstract);
        }

        if (session->remote.crypt->init) {
            unsigned char *iv = NULL, *secret = NULL;
            int free_iv = 0, free_secret = 0;

            LIBSSH2_KEX_METHOD_DIFFIE_HELLMAN_SHA1_HASH(iv,
                                                        session->remote.crypt->
                                                        iv_len, "B");
            if (!iv) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            LIBSSH2_KEX_METHOD_DIFFIE_HELLMAN_SHA1_HASH(secret,
                                                        session->remote.crypt->
                                                        secret_len, "D");
            if (!secret) {
                LIBSSH2_FREE(session, iv);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            if (session->remote.crypt->
                init(session, session->remote.crypt, iv, &free_iv, secret,
                     &free_secret, 0, &session->remote.crypt_abstract)) {
                LIBSSH2_FREE(session, iv);
                LIBSSH2_FREE(session, secret);
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }

            if (free_iv) {
                memset(iv, 0, session->remote.crypt->iv_len);
                LIBSSH2_FREE(session, iv);
            }

            if (free_secret) {
                memset(secret, 0, session->remote.crypt->secret_len);
                LIBSSH2_FREE(session, secret);
            }
        }
        _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                       "Server to Client IV and Key calculated");

        if (session->local.mac->dtor) {
            session->local.mac->dtor(session, &session->local.mac_abstract);
        }

        if (session->local.mac->init) {
            unsigned char *key = NULL;
            int free_key = 0;

            LIBSSH2_KEX_METHOD_DIFFIE_HELLMAN_SHA1_HASH(key,
                                                        session->local.mac->
                                                        key_len, "E");
            if (!key) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            session->local.mac->init(session, key, &free_key,
                                     &session->local.mac_abstract);

            if (free_key) {
                memset(key, 0, session->local.mac->key_len);
                LIBSSH2_FREE(session, key);
            }
        }
        _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                       "Client to Server HMAC Key calculated");

        if (session->remote.mac->dtor) {
            session->remote.mac->dtor(session, &session->remote.mac_abstract);
        }

        if (session->remote.mac->init) {
            unsigned char *key = NULL;
            int free_key = 0;

            LIBSSH2_KEX_METHOD_DIFFIE_HELLMAN_SHA1_HASH(key,
                                                        session->remote.mac->
                                                        key_len, "F");
            if (!key) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
            session->remote.mac->init(session, key, &free_key,
                                      &session->remote.mac_abstract);

            if (free_key) {
                memset(key, 0, session->remote.mac->key_len);
                LIBSSH2_FREE(session, key);
            }
        }
        _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                       "Server to Client HMAC Key calculated");

        /* Initialize compression for each direction */

        /* Cleanup any existing compression */
        if (session->local.comp && session->local.comp->dtor) {
            session->local.comp->dtor(session, 1,
                                      &session->local.comp_abstract);
        }

        if (session->local.comp && session->local.comp->init) {
            if (session->local.comp->init(session, 1,
                                          &session->local.comp_abstract)) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
        }
        _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                       "Client to Server compression initialized");

        if (session->remote.comp && session->remote.comp->dtor) {
            session->remote.comp->dtor(session, 0,
                                       &session->remote.comp_abstract);
        }

        if (session->remote.comp && session->remote.comp->init) {
            if (session->remote.comp->init(session, 0,
                                           &session->remote.comp_abstract)) {
                ret = LIBSSH2_ERROR_KEX_FAILURE;
                goto clean_exit;
            }
        }
        _libssh2_debug(session, LIBSSH2_TRACE_KEX,
                       "Server to Client compression initialized");

    }

  clean_exit:
    _libssh2_bn_free(exchange_state->x);
    exchange_state->x = NULL;
    _libssh2_bn_free(exchange_state->e);
    exchange_state->e = NULL;
    _libssh2_bn_free(exchange_state->f);
    exchange_state->f = NULL;
    _libssh2_bn_free(exchange_state->k);
    exchange_state->k = NULL;
    _libssh2_bn_ctx_free(exchange_state->ctx);
    exchange_state->ctx = NULL;

    if (exchange_state->e_packet) {
        LIBSSH2_FREE(session, exchange_state->e_packet);
        exchange_state->e_packet = NULL;
    }

    if (exchange_state->s_packet) {
        LIBSSH2_FREE(session, exchange_state->s_packet);
        exchange_state->s_packet = NULL;
    }

    if (exchange_state->k_value) {
        LIBSSH2_FREE(session, exchange_state->k_value);
        exchange_state->k_value = NULL;
    }

    exchange_state->state = libssh2_NB_state_idle;

    return ret;
}